

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanAnalyzer.cpp
# Opt level: O0

void __thiscall CanAnalyzer::GetRawFrame(CanAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  BitState BVar2;
  BitState BVar3;
  element_type *peVar4;
  U64 UVar5;
  reference pvVar6;
  size_type sVar7;
  BitState local_1c;
  BitState local_18;
  uint local_14;
  CanAnalyzer *pCStack_10;
  U32 i;
  CanAnalyzer *this_local;
  
  this->mCanError = false;
  this->mRecessiveCount = 0;
  this->mDominantCount = 0;
  pCStack_10 = this;
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mRawBitResults);
  BVar2 = AnalyzerChannelData::GetBitState();
  peVar4 = std::auto_ptr<CanAnalyzerSettings>::operator->(&this->mSettings);
  BVar3 = CanAnalyzerSettings::Dominant(peVar4);
  if (BVar2 != BVar3) {
    AnalyzerHelpers::Assert("GetFrameOrError assumes we start DOMINANT");
  }
  UVar5 = AnalyzerChannelData::GetSampleNumber();
  this->mStartOfFrame = UVar5;
  local_14 = 0;
  do {
    while( true ) {
      if (0xff < local_14) {
        return;
      }
      pAVar1 = this->mCan;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (&this->mSampleOffsets,(ulong)local_14);
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
      local_14 = local_14 + 1;
      BVar2 = AnalyzerChannelData::GetBitState();
      peVar4 = std::auto_ptr<CanAnalyzerSettings>::operator->(&this->mSettings);
      BVar3 = CanAnalyzerSettings::Dominant(peVar4);
      if (BVar2 == BVar3) break;
      this->mRecessiveCount = this->mRecessiveCount + 1;
      this->mDominantCount = 0;
      peVar4 = std::auto_ptr<CanAnalyzerSettings>::operator->(&this->mSettings);
      local_1c = CanAnalyzerSettings::Recessive(peVar4);
      std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mRawBitResults,&local_1c);
      if (this->mRecessiveCount == 7) goto LAB_0010f86a;
    }
    this->mDominantCount = this->mDominantCount + 1;
    this->mRecessiveCount = 0;
    peVar4 = std::auto_ptr<CanAnalyzerSettings>::operator->(&this->mSettings);
    local_18 = CanAnalyzerSettings::Dominant(peVar4);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mRawBitResults,&local_18);
  } while (this->mDominantCount != 6);
  this->mCanError = true;
  UVar5 = this->mStartOfFrame;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->mSampleOffsets,(ulong)(local_14 - 5));
  this->mErrorStartingSample = UVar5 + *pvVar6;
  UVar5 = this->mStartOfFrame;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->mSampleOffsets,(ulong)local_14);
  this->mErrorEndingSample = UVar5 + *pvVar6;
  std::vector<BitState,_std::allocator<BitState>_>::pop_back(&this->mRawBitResults);
  std::vector<BitState,_std::allocator<BitState>_>::pop_back(&this->mRawBitResults);
  std::vector<BitState,_std::allocator<BitState>_>::pop_back(&this->mRawBitResults);
  std::vector<BitState,_std::allocator<BitState>_>::pop_back(&this->mRawBitResults);
  std::vector<BitState,_std::allocator<BitState>_>::pop_back(&this->mRawBitResults);
  std::vector<BitState,_std::allocator<BitState>_>::pop_back(&this->mRawBitResults);
  sVar7 = std::vector<BitState,_std::allocator<BitState>_>::size(&this->mRawBitResults);
  this->mNumRawBits = (U32)sVar7;
LAB_0010f86a:
  sVar7 = std::vector<BitState,_std::allocator<BitState>_>::size(&this->mRawBitResults);
  this->mNumRawBits = (U32)sVar7;
  return;
}

Assistant:

void CanAnalyzer::GetRawFrame()
{
    mCanError = false;
    mRecessiveCount = 0;
    mDominantCount = 0;
    mRawBitResults.clear();

    if( mCan->GetBitState() != mSettings->Dominant() )
        AnalyzerHelpers::Assert( "GetFrameOrError assumes we start DOMINANT" );

    mStartOfFrame = mCan->GetSampleNumber();

    U32 i = 0;
    // what we're going to do now is capture a sequence up until we get 7 recessive bits in a row.
    for( ;; )
    {
        if( i > 255 )
        {
            // we are in garbage data most likely, lets get out of here.
            return;
        }

        mCan->AdvanceToAbsPosition( mStartOfFrame + mSampleOffsets[ i ] );
        i++;

        if( mCan->GetBitState() == mSettings->Dominant() )
        {
            // the bit is DOMINANT
            mDominantCount++;
            mRecessiveCount = 0;
            mRawBitResults.push_back( mSettings->Dominant() );

            if( mDominantCount == 6 )
            {
                // we have detected an error.

                mCanError = true;
                mErrorStartingSample = mStartOfFrame + mSampleOffsets[ i - 5 ];
                mErrorEndingSample = mStartOfFrame + mSampleOffsets[ i ];

                // don't use any of these error bits in analysis.
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();

                mNumRawBits = mRawBitResults.size();

                // the channel is currently high.  addvance it to the next start bit.
                // no, don't bother, we want to analyze this packet before we advance.

                break;
            }
        }
        else
        {
            // the bit is RECESSIVE
            mRecessiveCount++;
            mDominantCount = 0;
            mRawBitResults.push_back( mSettings->Recessive() );

            if( mRecessiveCount == 7 )
            {
                // we're done.
                break;
            }
        }
    }

    mNumRawBits = mRawBitResults.size();
}